

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Syn2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  If_DsdMan_t *p;
  Gia_Man_t *pNew;
  char *pcVar3;
  char *pcVar4;
  uint fVeryVerbose;
  uint fCutMin;
  uint fVerbose;
  int iVar5;
  uint local_4c;
  uint local_44;
  uint local_40;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  local_4c = 0x14;
  local_40 = 1;
  local_44 = 0;
  fCutMin = 0;
  bVar1 = false;
  fVeryVerbose = 0;
  do {
    while( true ) {
      while( true ) {
        while (iVar2 = Extra_UtilGetopt(argc,argv,"Rakmdvwh"), iVar5 = globalUtilOptind,
              iVar2 == 0x77) {
          fVeryVerbose = fVeryVerbose ^ 1;
        }
        if (iVar2 < 100) break;
        if (iVar2 < 0x6d) {
          if (iVar2 == 100) {
            bVar1 = (bool)(bVar1 ^ 1);
          }
          else {
            if (iVar2 != 0x6b) goto LAB_0027d8b9;
            local_40 = local_40 ^ 1;
          }
        }
        else if (iVar2 == 0x6d) {
          fCutMin = fCutMin ^ 1;
        }
        else {
          if (iVar2 != 0x76) goto LAB_0027d8b9;
          fVerbose = fVerbose ^ 1;
        }
      }
      if (iVar2 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          iVar5 = 0;
          if (bVar1) {
            p = (If_DsdMan_t *)Abc_FrameReadManDsd();
            iVar5 = 1;
            if ((p != (If_DsdMan_t *)0x0) && (iVar2 = If_DsdManVarNum(p), iVar2 < 6)) {
              puts(
                  "DSD manager has incompatible number of variables. Delay minimization is not performed."
                  );
              iVar5 = 0;
            }
          }
          pNew = Gia_ManAigSyn2(pAbc->pGia,local_44,local_40,fCutMin,local_4c,iVar5,fVerbose,
                                fVeryVerbose);
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9Syn2(): There is no AIG.\n";
        iVar5 = -1;
        goto LAB_0027da53;
      }
      if (iVar2 == 0x52) break;
      if (iVar2 != 0x61) goto LAB_0027d8b9;
      local_44 = local_44 ^ 1;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
      return 0;
    }
    local_4c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
  } while (-1 < (int)local_4c);
LAB_0027d8b9:
  Abc_Print(-2,"usage: &syn2 [-R num] [-akmdvh]\n");
  Abc_Print(-2,"\t           performs AIG optimization\n");
  Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",(ulong)local_4c
           );
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (local_44 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-a       : toggles using the old algorithm [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_40 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fCutMin == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (!bVar1) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-d       : toggles additional delay optimization [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v       : toggles printing verbose information [default = %s]\n",pcVar3);
  if (fVeryVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-w       : toggles printing additional information [default = %s]\n",pcVar4);
  pcVar3 = "\t-h       : print the command usage\n";
  iVar5 = -2;
LAB_0027da53:
  Abc_Print(iVar5,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Syn2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose  =  0;
    int fOldAlgo     =  0;
    int fCoarsen     =  1;
    int fCutMin      =  0;
    int nRelaxRatio  = 20;
    int fDelayMin    =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Rakmdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRelaxRatio < 0 )
                goto usage;
            break;
        case 'a':
            fOldAlgo ^= 1;
            break;
        case 'k':
            fCoarsen ^= 1;
            break;
        case 'm':
            fCutMin ^= 1;
            break;
        case 'd':
            fDelayMin ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Syn2(): There is no AIG.\n" );
        return 1;
    }
    if ( fDelayMin )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( p && If_DsdManVarNum(p) < 6 )
        {
            printf( "DSD manager has incompatible number of variables. Delay minimization is not performed.\n" );
            fDelayMin = 0;
        }
    }
    pTemp = Gia_ManAigSyn2( pAbc->pGia, fOldAlgo, fCoarsen, fCutMin, nRelaxRatio, fDelayMin, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &syn2 [-R num] [-akmdvh]\n" );
    Abc_Print( -2, "\t           performs AIG optimization\n" );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",   nRelaxRatio );
    Abc_Print( -2, "\t-a       : toggles using the old algorithm [default = %s]\n",         fOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n",    fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n",                fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles additional delay optimization [default = %s]\n",   fDelayMin? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}